

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerGeneratorHelper::InsertNullOutGeneratorFrameInEpilogue
          (LowerGeneratorHelper *this,LabelInstr *epilogueLabel)

{
  Instr *insertBeforeInstr;
  Func *this_00;
  uint16 uVar1;
  StackSym *stackSym;
  SymOpnd *src;
  RegOpnd *baseOpnd;
  IndirOpnd *dst;
  AddrOpnd *src_00;
  
  insertBeforeInstr = (epilogueLabel->super_Instr).m_next;
  stackSym = StackSym::NewImplicitParamSym(3,this->func);
  this_00 = this->func;
  uVar1 = LowererMD::GetFormalParamOffset();
  Func::SetArgOffset(this_00,stackSym,(uint)uVar1 << 3);
  src = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,this->func);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->func);
  baseOpnd->m_reg = RegArg3;
  InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  dst = IR::IndirOpnd::New(baseOpnd,0x20,TyUint64,this->func,false);
  src_00 = IR::AddrOpnd::NewNull(this->func);
  InsertMove(&dst->super_Opnd,&src_00->super_Opnd,insertBeforeInstr,false);
  return;
}

Assistant:

void Lowerer::LowerGeneratorHelper::InsertNullOutGeneratorFrameInEpilogue(IR::LabelInstr* epilogueLabel)
{
    IR::Instr* insertionPoint = epilogueLabel->m_next;

    // null out frame pointer on generator object to signal completion to JavascriptGenerator::CallGenerator
    // s = MOV prm1
    // s[offset of JavascriptGenerator::frame] = MOV nullptr
    StackSym* symSrc = StackSym::NewImplicitParamSym(3, this->func);
    this->func->SetArgOffset(symSrc, LowererMD::GetFormalParamOffset() * MachPtr);
    IR::SymOpnd* srcOpnd = IR::SymOpnd::New(symSrc, TyMachPtr, this->func);
    IR::RegOpnd* dstOpnd = IR::RegOpnd::New(TyMachReg, this->func);

    // Since we are already in the epilogue, use one of the caller-saved
    // registers to store the address to our interpreter frame
#if defined(_M_X64)
    dstOpnd->SetReg(RegRCX);
#elif defined(_M_IX86)
    dstOpnd->SetReg(RegECX);
#endif

    InsertMove(dstOpnd, srcOpnd, insertionPoint);

    IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(dstOpnd, Js::JavascriptGenerator::GetFrameOffset(), TyMachPtr, this->func);
    IR::AddrOpnd* addrOpnd = IR::AddrOpnd::NewNull(this->func);
    InsertMove(indirOpnd, addrOpnd, insertionPoint, false /* generateWriteBarrier */);
}